

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageOneofFieldGenerator::GenerateNonInlineAccessorDefinitions
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  long lVar1;
  Descriptor *pDVar2;
  char *format_00;
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,
             &(this->super_MessageFieldGenerator).super_FieldGenerator.variables_._M_t);
  Formatter::operator()<>
            (&local_48,
             "void $classname$::set_allocated_$name$($type$* $name$) {\n  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n  clear_$oneof_name$();\n  if ($name$) {\n"
            );
  this_00 = (this->super_MessageFieldGenerator).super_FieldGenerator.descriptor_;
  lVar1 = *(long *)(this_00 + 0x10);
  pDVar2 = FieldDescriptor::message_type(this_00);
  format_00 = 
  "    ::$proto_ns$::Arena* submessage_arena =\n        ::$proto_ns$::Arena::InternalHelper<\n            ::$proto_ns$::MessageLite>::GetOwningArena(\n                reinterpret_cast<::$proto_ns$::MessageLite*>($name$));\n"
  ;
  if (lVar1 == *(long *)(pDVar2 + 0x10)) {
    format_00 = 
    "    ::$proto_ns$::Arena* submessage_arena =\n      ::$proto_ns$::Arena::InternalHelper<$type$>::GetOwningArena($name$);\n"
    ;
  }
  Formatter::operator()<>(&local_48,format_00);
  Formatter::operator()<>
            (&local_48,
             "    if (message_arena != submessage_arena) {\n      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n          message_arena, $name$, submessage_arena);\n    }\n    set_has_$name$();\n    $field_member$ = $name$;\n  }\n$annotate_set$  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void MessageOneofFieldGenerator::GenerateNonInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "void $classname$::set_allocated_$name$($type$* $name$) {\n"
      "  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n"
      "  clear_$oneof_name$();\n"
      "  if ($name$) {\n");
  if (descriptor_->file() != descriptor_->message_type()->file()) {
    // We have to read the arena through the virtual method, because the type
    // isn't defined in this file.
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "        ::$proto_ns$::Arena::InternalHelper<\n"
        "            ::$proto_ns$::MessageLite>::GetOwningArena(\n"
        "                reinterpret_cast<::$proto_ns$::MessageLite*>("
        "$name$));\n");
  } else {
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "      ::$proto_ns$::Arena::InternalHelper<"
        "$type$>::GetOwningArena($name$);\n");
  }
  format(
      "    if (message_arena != submessage_arena) {\n"
      "      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n"
      "          message_arena, $name$, submessage_arena);\n"
      "    }\n"
      "    set_has_$name$();\n"
      "    $field_member$ = $name$;\n"
      "  }\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n");
}